

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImageCubeEmptyTexCase::createTexture
          (TexSubImageCubeEmptyTexCase *this)

{
  deUint32 format;
  deUint32 type;
  deUint32 dVar1;
  int iVar2;
  char *str;
  void *data_00;
  PixelBufferAccess local_e8;
  PixelBufferAccess local_c0;
  undefined1 local_94 [8];
  Vec4 gMax;
  Vec4 gMin;
  int face_1;
  int levelSize_1;
  int ndx_1;
  int face;
  int levelSize;
  int ndx;
  undefined1 local_50 [8];
  Random rnd;
  TextureLevel data;
  deUint32 tex;
  TexSubImageCubeEmptyTexCase *this_local;
  
  data.m_data.m_cap._4_4_ = 0;
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&rnd.m_rnd.z,&(this->super_TextureCubeSpecCase).m_texFormat);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_50,dVar1);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&data.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             data.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (face = 0; face < (this->super_TextureCubeSpecCase).m_numLevels; face = face + 1) {
    iVar2 = de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)face & 0x1f));
    for (levelSize_1 = 0; levelSize_1 < 6; levelSize_1 = levelSize_1 + 1) {
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,
                 *(deUint32 *)(s_cubeMapFaces + (long)levelSize_1 * 4),face,this->m_internalFormat,
                 iVar2,iVar2,0,this->m_format,this->m_dataType,(void *)0x0);
    }
  }
  for (face_1 = 0; face_1 < (this->super_TextureCubeSpecCase).m_numLevels; face_1 = face_1 + 1) {
    iVar2 = de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)face_1 & 0x1f));
    tcu::TextureLevel::setSize((TextureLevel *)&rnd.m_rnd.z,iVar2,iVar2,1);
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < 6;
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_50,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
      randomVector<4>((Functional *)local_94,(Random *)local_50,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
      tcu::TextureLevel::getAccess(&local_c0,(TextureLevel *)&rnd.m_rnd.z);
      tcu::fillWithComponentGradients(&local_c0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_94);
      dVar1 = *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[2] * 4);
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_e8,(TextureLevel *)&rnd.m_rnd.z);
      data_00 = tcu::PixelBufferAccess::getDataPtr(&local_e8);
      sglr::ContextWrapper::glTexSubImage2D
                (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,dVar1
                 ,face_1,0,0,iVar2,iVar2,format,type,data_00);
    }
  }
  de::Random::~Random((Random *)local_50);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Specify storage for each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify data using glTexSubImage2D()
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			data.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, 0, 0, levelSize, levelSize, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}